

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::WriteTopLevelProject
          (cmGlobalGhsMultiGenerator *this,ostream *fout,cmLocalGenerator *root)

{
  bool bVar1;
  ostream *poVar2;
  cmake *pcVar3;
  char *pcVar4;
  char local_a2 [2];
  char *local_a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  allocator<char> local_89;
  string local_88;
  char *local_68;
  char *osDirOption;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *bspName;
  cmLocalGenerator *root_local;
  ostream *fout_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  bspName = (char *)root;
  root_local = (cmLocalGenerator *)fout;
  fout_local = (ostream *)this;
  WriteFileHeader(this,fout);
  WriteMacros(this,(ostream *)root_local,(cmLocalGenerator *)bspName);
  WriteHighLevelDirectives(this,(cmLocalGenerator *)bspName,(ostream *)root_local);
  GhsMultiGpj::WriteGpjTag(PROJECT,(ostream *)root_local);
  poVar2 = std::operator<<((ostream *)root_local,"# Top Level Project File");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pcVar3 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"GHS_BSP_NAME",&local_49);
  pcVar4 = cmake::GetCacheDefinition(pcVar3,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_28 = pcVar4;
  bVar1 = cmSystemTools::IsOff(pcVar4);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)root_local,"    -bsp ");
    poVar2 = std::operator<<(poVar2,local_28);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmSystemTools::IsOff(pcVar4);
  if (!bVar1) {
    pcVar3 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"GHS_OS_DIR_OPTION",&local_89);
    pcVar4 = cmake::GetCacheDefinition(pcVar3,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    local_68 = pcVar4;
    local_98._M_current = (char *)std::__cxx11::string::begin();
    local_a0 = (char *)std::__cxx11::string::end();
    local_a2[1] = 0x5c;
    local_a2[0] = '/';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_98,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_a0,local_a2 + 1,local_a2);
    std::operator<<((ostream *)root_local,"    ");
    bVar1 = cmSystemTools::IsOff(local_68);
    if (bVar1) {
      std::operator<<((ostream *)root_local,"");
    }
    else {
      std::operator<<((ostream *)root_local,local_68);
    }
    poVar2 = std::operator<<((ostream *)root_local,"\"");
    poVar2 = std::operator<<(poVar2,(string *)&this->OsDir);
    poVar2 = std::operator<<(poVar2,"\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteTopLevelProject(std::ostream& fout,
                                                     cmLocalGenerator* root)
{
  this->WriteFileHeader(fout);
  this->WriteMacros(fout, root);
  this->WriteHighLevelDirectives(root, fout);
  GhsMultiGpj::WriteGpjTag(GhsMultiGpj::PROJECT, fout);

  fout << "# Top Level Project File" << std::endl;

  // Specify BSP option if supplied by user
  const char* bspName =
    this->GetCMakeInstance()->GetCacheDefinition("GHS_BSP_NAME");
  if (!cmSystemTools::IsOff(bspName)) {
    fout << "    -bsp " << bspName << std::endl;
  }

  // Specify OS DIR if supplied by user
  // -- not all platforms require this entry in the project file
  if (!cmSystemTools::IsOff(this->OsDir.c_str())) {
    const char* osDirOption =
      this->GetCMakeInstance()->GetCacheDefinition("GHS_OS_DIR_OPTION");
    std::replace(this->OsDir.begin(), this->OsDir.end(), '\\', '/');
    fout << "    ";
    if (cmSystemTools::IsOff(osDirOption)) {
      fout << "";
    } else {
      fout << osDirOption;
    }
    fout << "\"" << this->OsDir << "\"" << std::endl;
  }
}